

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O2

void __thiscall serialize_tests::array::test_method(array *this)

{
  long lVar1;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  char *local_e0;
  char *local_d8;
  lazy_ostream local_d0;
  undefined1 *local_c0;
  char **local_b8;
  assertion_result local_b0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  DataStream ds;
  array<unsigned_char,_32UL> array2;
  array<unsigned_char,_32UL> array1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  array1._M_elems[0x10] = '\0';
  array1._M_elems[0x11] = '\0';
  array1._M_elems[0x12] = '\x01';
  array1._M_elems[0x13] = '\x01';
  array1._M_elems[0x14] = '\x01';
  array1._M_elems[0x15] = '\x01';
  array1._M_elems[0x16] = '\0';
  array1._M_elems[0x17] = '\x01';
  array1._M_elems[0x18] = '\0';
  array1._M_elems[0x19] = '\0';
  array1._M_elems[0x1a] = '\x01';
  array1._M_elems[0x1b] = '\0';
  array1._M_elems[0x1c] = '\0';
  array1._M_elems[0x1d] = '\0';
  array1._M_elems[0x1e] = '\0';
  array1._M_elems[0x1f] = '\0';
  array1._M_elems[0] = '\x01';
  array1._M_elems[1] = '\0';
  array1._M_elems[2] = '\0';
  array1._M_elems[3] = '\x01';
  array1._M_elems[4] = '\x01';
  array1._M_elems[5] = '\x01';
  array1._M_elems[6] = '\0';
  array1._M_elems[7] = '\0';
  array1._M_elems[8] = '\0';
  array1._M_elems[9] = '\0';
  array1._M_elems[10] = '\x01';
  array1._M_elems[0xb] = '\0';
  array1._M_elems[0xc] = '\0';
  array1._M_elems[0xd] = '\x01';
  array1._M_elems[0xe] = '\x01';
  array1._M_elems[0xf] = '\0';
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ds.m_read_pos = 0;
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Serialize<DataStream,_unsigned_char,_32UL>(&ds,&array1);
  Unserialize<DataStream,_unsigned_char,_32UL>(&ds,&array2);
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xcb;
  file.m_begin = (iterator)&local_88;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_98,msg);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)std::operator==(&array1,&array2);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b8 = &local_e0;
  local_e0 = "array1 == array2";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,0xc1b930,(size_t)&stack0xffffffffffffff10,0xcb);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ds);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(array)
{
    std::array<uint8_t, 32> array1{1, 0, 0, 1, 1, 1, 0, 0, 0, 0, 1, 0, 0, 1, 1, 0, 0, 0, 1, 1, 1, 1, 0, 1, 0, 0, 1};
    DataStream ds;
    ds << array1;
    std::array<uint8_t, 32> array2;
    ds >> array2;
    BOOST_CHECK(array1 == array2);
}